

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::
TestFactoryImpl<gtest_suite_WienerDenoiseTest_::InvalidBlockSize<BitDepthParams<unsigned_short,_8,_true>_>_>
::CreateTest(TestFactoryImpl<gtest_suite_WienerDenoiseTest_::InvalidBlockSize<BitDepthParams<unsigned_short,_8,_true>_>_>
             *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x118);
  Test::Test(this_00);
  memset(this_00 + 1,0,0xd8);
  this_00->_vptr_Test = (_func_int **)&PTR__WienerDenoiseTest_01053a78;
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }